

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_window_quantiles.cc
# Opt level: O3

CKMSQuantiles * __thiscall
prometheus::detail::TimeWindowQuantiles::rotate(TimeWindowQuantiles *this)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  pointer pCVar4;
  
  lVar2 = std::chrono::_V2::steady_clock::now();
  lVar2 = lVar2 - (this->last_rotation_).__d.__r;
  if ((this->rotation_interval_).__r < lVar2) {
    pCVar4 = (this->ckms_quantiles_).
             super__Vector_base<prometheus::detail::CKMSQuantiles,_std::allocator<prometheus::detail::CKMSQuantiles>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar3 = this->current_bucket_;
    do {
      CKMSQuantiles::reset(pCVar4 + uVar3);
      uVar3 = this->current_bucket_ + 1;
      pCVar4 = (this->ckms_quantiles_).
               super__Vector_base<prometheus::detail::CKMSQuantiles,_std::allocator<prometheus::detail::CKMSQuantiles>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(((long)(this->ckms_quantiles_).
                         super__Vector_base<prometheus::detail::CKMSQuantiles,_std::allocator<prometheus::detail::CKMSQuantiles>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar4 >> 4) *
                 -0x78693bb3194be3ab) <= uVar3) {
        uVar3 = 0;
      }
      this->current_bucket_ = uVar3;
      lVar1 = (this->rotation_interval_).__r;
      lVar2 = lVar2 - lVar1;
      (this->last_rotation_).__d.__r = (this->last_rotation_).__d.__r + lVar1;
    } while (lVar1 < lVar2);
  }
  else {
    pCVar4 = (this->ckms_quantiles_).
             super__Vector_base<prometheus::detail::CKMSQuantiles,_std::allocator<prometheus::detail::CKMSQuantiles>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar3 = this->current_bucket_;
  }
  return pCVar4 + uVar3;
}

Assistant:

CKMSQuantiles& TimeWindowQuantiles::rotate() const {
  auto delta = Clock::now() - last_rotation_;
  while (delta > rotation_interval_) {
    ckms_quantiles_[current_bucket_].reset();

    if (++current_bucket_ >= ckms_quantiles_.size()) {
      current_bucket_ = 0;
    }

    delta -= rotation_interval_;
    last_rotation_ += rotation_interval_;
  }
  return ckms_quantiles_[current_bucket_];
}